

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O0

void print_result(int f,float res,v_array<char> tag,float lb,float ub)

{
  v_array<char> tag_00;
  long lVar1;
  ssize_t sVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  int in_EDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  void *in_stack_00000008;
  undefined8 in_stack_00000010;
  ssize_t t;
  ssize_t len;
  stringstream ss;
  char temp [30];
  int f_00;
  stringstream *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd80;
  string *this;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  size_t in_stack_fffffffffffffd98;
  string local_248 [32];
  ssize_t local_228;
  string local_220 [32];
  long local_200;
  stringstream local_1c0 [16];
  ostream local_1b0;
  char local_38 [40];
  float local_10;
  float local_c;
  
  if (-1 < in_EDI) {
    local_10 = in_XMM2_Da;
    local_c = in_XMM1_Da;
    sprintf(local_38,"%f",SUB84((double)in_XMM0_Da,0));
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::operator<<(&local_1b0,local_38);
    tag_00._end = (char *)in_stack_fffffffffffffd88;
    tag_00._begin = (char *)in_stack_fffffffffffffd80;
    tag_00.end_array._0_4_ = in_stack_fffffffffffffd90;
    tag_00.end_array._4_4_ = in_stack_fffffffffffffd94;
    tag_00.erase_count = in_stack_fffffffffffffd98;
    f_00 = in_stack_00000010._4_4_;
    print_tag(in_stack_fffffffffffffd70,tag_00);
    std::operator<<(&local_1b0,' ');
    sprintf(local_38,"%f",SUB84((double)local_c,0));
    std::operator<<(&local_1b0,local_38);
    std::operator<<(&local_1b0,' ');
    pcVar5 = local_38;
    sprintf(pcVar5,"%f",SUB84((double)local_10,0));
    std::operator<<(&local_1b0,pcVar5);
    std::operator<<(&local_1b0,'\n');
    std::__cxx11::stringstream::str();
    this = local_220;
    lVar1 = std::__cxx11::string::size();
    std::__cxx11::string::~string(this);
    local_200 = lVar1;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sVar2 = io_buf::write_file_or_socket(f_00,in_stack_00000008,0x28cb79);
    std::__cxx11::string::~string(local_248);
    local_228 = sVar2;
    if (sVar2 != local_200) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return;
}

Assistant:

void print_result(int f, float res, v_array<char> tag, float lb, float ub)
{
  if (f >= 0)
  {
    char temp[30];
    sprintf(temp, "%f", res);
    std::stringstream ss;
    ss << temp;
    print_tag(ss, tag);
    ss << ' ';
    sprintf(temp, "%f", lb);
    ss << temp;
    ss << ' ';
    sprintf(temp, "%f", ub);
    ss << temp;
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}